

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glad.c
# Opt level: O0

void load_GL_NV_register_combiners(GLADloadproc load)

{
  GLADloadproc load_local;
  
  if (GLAD_GL_NV_register_combiners != 0) {
    glad_glCombinerParameterfvNV =
         (PFNGLCOMBINERPARAMETERFVNVPROC)(*load)("glCombinerParameterfvNV");
    glad_glCombinerParameterfNV = (PFNGLCOMBINERPARAMETERFNVPROC)(*load)("glCombinerParameterfNV");
    glad_glCombinerParameterivNV =
         (PFNGLCOMBINERPARAMETERIVNVPROC)(*load)("glCombinerParameterivNV");
    glad_glCombinerParameteriNV = (PFNGLCOMBINERPARAMETERINVPROC)(*load)("glCombinerParameteriNV");
    glad_glCombinerInputNV = (PFNGLCOMBINERINPUTNVPROC)(*load)("glCombinerInputNV");
    glad_glCombinerOutputNV = (PFNGLCOMBINEROUTPUTNVPROC)(*load)("glCombinerOutputNV");
    glad_glFinalCombinerInputNV = (PFNGLFINALCOMBINERINPUTNVPROC)(*load)("glFinalCombinerInputNV");
    glad_glGetCombinerInputParameterfvNV =
         (PFNGLGETCOMBINERINPUTPARAMETERFVNVPROC)(*load)("glGetCombinerInputParameterfvNV");
    glad_glGetCombinerInputParameterivNV =
         (PFNGLGETCOMBINERINPUTPARAMETERIVNVPROC)(*load)("glGetCombinerInputParameterivNV");
    glad_glGetCombinerOutputParameterfvNV =
         (PFNGLGETCOMBINEROUTPUTPARAMETERFVNVPROC)(*load)("glGetCombinerOutputParameterfvNV");
    glad_glGetCombinerOutputParameterivNV =
         (PFNGLGETCOMBINEROUTPUTPARAMETERIVNVPROC)(*load)("glGetCombinerOutputParameterivNV");
    glad_glGetFinalCombinerInputParameterfvNV =
         (PFNGLGETFINALCOMBINERINPUTPARAMETERFVNVPROC)
         (*load)("glGetFinalCombinerInputParameterfvNV");
    glad_glGetFinalCombinerInputParameterivNV =
         (PFNGLGETFINALCOMBINERINPUTPARAMETERIVNVPROC)
         (*load)("glGetFinalCombinerInputParameterivNV");
  }
  return;
}

Assistant:

static void load_GL_NV_register_combiners(GLADloadproc load) {
	if(!GLAD_GL_NV_register_combiners) return;
	glad_glCombinerParameterfvNV = (PFNGLCOMBINERPARAMETERFVNVPROC)load("glCombinerParameterfvNV");
	glad_glCombinerParameterfNV = (PFNGLCOMBINERPARAMETERFNVPROC)load("glCombinerParameterfNV");
	glad_glCombinerParameterivNV = (PFNGLCOMBINERPARAMETERIVNVPROC)load("glCombinerParameterivNV");
	glad_glCombinerParameteriNV = (PFNGLCOMBINERPARAMETERINVPROC)load("glCombinerParameteriNV");
	glad_glCombinerInputNV = (PFNGLCOMBINERINPUTNVPROC)load("glCombinerInputNV");
	glad_glCombinerOutputNV = (PFNGLCOMBINEROUTPUTNVPROC)load("glCombinerOutputNV");
	glad_glFinalCombinerInputNV = (PFNGLFINALCOMBINERINPUTNVPROC)load("glFinalCombinerInputNV");
	glad_glGetCombinerInputParameterfvNV = (PFNGLGETCOMBINERINPUTPARAMETERFVNVPROC)load("glGetCombinerInputParameterfvNV");
	glad_glGetCombinerInputParameterivNV = (PFNGLGETCOMBINERINPUTPARAMETERIVNVPROC)load("glGetCombinerInputParameterivNV");
	glad_glGetCombinerOutputParameterfvNV = (PFNGLGETCOMBINEROUTPUTPARAMETERFVNVPROC)load("glGetCombinerOutputParameterfvNV");
	glad_glGetCombinerOutputParameterivNV = (PFNGLGETCOMBINEROUTPUTPARAMETERIVNVPROC)load("glGetCombinerOutputParameterivNV");
	glad_glGetFinalCombinerInputParameterfvNV = (PFNGLGETFINALCOMBINERINPUTPARAMETERFVNVPROC)load("glGetFinalCombinerInputParameterfvNV");
	glad_glGetFinalCombinerInputParameterivNV = (PFNGLGETFINALCOMBINERINPUTPARAMETERIVNVPROC)load("glGetFinalCombinerInputParameterivNV");
}